

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O3

Card ** cards_createFromIds(char *idAsString)

{
  unsigned_long uVar1;
  char **__ptr;
  Card **ppCVar2;
  Card *pCVar3;
  char *id;
  long lVar4;
  
  uVar1 = strchrcount(idAsString,',');
  __ptr = strchrexplode(idAsString,',');
  ppCVar2 = (Card **)malloc(uVar1 * 8 + 8);
  id = *__ptr;
  if (id != (char *)0x0) {
    lVar4 = 0;
    do {
      pCVar3 = card_createFromId(id);
      *(Card **)((long)ppCVar2 + lVar4) = pCVar3;
      free(*(void **)((long)__ptr + lVar4));
      id = *(char **)((long)__ptr + lVar4 + 8);
      lVar4 = lVar4 + 8;
    } while (id != (char *)0x0);
  }
  free(__ptr);
  return ppCVar2;
}

Assistant:

Card ** cards_createFromIds(char * idAsString)
{
	unsigned long cardCount = strchrcount(idAsString, ',')+1;
	char ** ids = strchrexplode(idAsString, ',');
	char ** id;
	unsigned long i;
	Card ** cards = (Card **)malloc(sizeof(Card *)*cardCount);

	for(i=0,id=ids;*id;id++,i++)
	{
		cards[i] = card_createFromId(*id);
		free(*id);
	}
	free(ids);

	return cards;
}